

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::setTitle(WindowImplX11 *this,String *title)

{
  undefined8 uVar1;
  Atom AVar2;
  Atom AVar3;
  uchar *puVar4;
  size_type sVar5;
  locale *locale;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_RSI;
  long in_RDI;
  Atom wmIconName;
  Atom wmName;
  Atom useUtf8;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  utf8Title;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined4 uVar8;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *this_00;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffdc8;
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffdd0;
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffdd8;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *in_stack_fffffffffffffde0;
  locale *this_01;
  undefined8 in_stack_fffffffffffffdf0;
  undefined1 onlyIfExists;
  undefined8 uVar9;
  string *in_stack_fffffffffffffdf8;
  String *this_02;
  locale local_140 [8];
  string local_138 [32];
  locale local_118 [8];
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  Atom local_c8;
  allocator local_b9;
  string local_b8 [32];
  Atom local_98;
  allocator local_89;
  string local_88 [32];
  Atom local_68;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *local_60;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *local_58;
  uint *local_50;
  uint *local_38;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_30;
  undefined8 local_10;
  
  onlyIfExists = (undefined1)((ulong)in_stack_fffffffffffffdf0 >> 0x38);
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  local_10 = in_RSI;
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string(in_stack_fffffffffffffde0);
  local_38 = (uint *)String::begin_abi_cxx11_((String *)in_stack_fffffffffffffdb8);
  local_50 = (uint *)String::end_abi_cxx11_((String *)in_stack_fffffffffffffdb8);
  local_58 = (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)std::
                back_inserter<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                          (in_stack_fffffffffffffdb8);
  local_60 = (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)Utf<32u>::
                toUtf8<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
                          (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                           in_stack_fffffffffffffdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"UTF8_STRING",&local_89);
  AVar2 = getAtom(in_stack_fffffffffffffdf8,(bool)onlyIfExists);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_68 = AVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"_NET_WM_NAME",&local_b9);
  AVar3 = getAtom(in_stack_fffffffffffffdf8,(bool)onlyIfExists);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  AVar2 = local_68;
  uVar1 = *(undefined8 *)(in_RDI + 0x3c8);
  uVar9 = *(undefined8 *)(in_RDI + 0x3d0);
  local_98 = AVar3;
  puVar4 = std::__cxx11::
           basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           ::c_str((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                    *)0x24a5c7);
  sVar5 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::size(&local_30);
  XChangeProperty(uVar9,uVar1,AVar3,AVar2,8,0,puVar4,CONCAT44(uVar8,(int)sVar5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"_NET_WM_ICON_NAME",&local_e9);
  AVar3 = getAtom(in_stack_fffffffffffffdf8,(bool)onlyIfExists);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  AVar2 = local_68;
  uVar1 = *(undefined8 *)(in_RDI + 0x3c8);
  this_02 = *(String **)(in_RDI + 0x3d0);
  local_c8 = AVar3;
  locale = (locale *)
           std::__cxx11::
           basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           ::c_str((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                    *)0x24a6e3);
  sVar5 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::size(&local_30);
  XChangeProperty(this_02,uVar1,AVar3,AVar2,8,0,locale,sVar5 & 0xffffffff);
  uVar1 = *(undefined8 *)(in_RDI + 0x3c8);
  uVar9 = *(undefined8 *)(in_RDI + 0x3d0);
  std::locale::locale(local_118);
  String::toAnsiString_abi_cxx11_(this_02,locale);
  uVar6 = std::__cxx11::string::c_str();
  this_01 = local_140;
  std::locale::locale(this_01);
  String::toAnsiString_abi_cxx11_(this_02,locale);
  uVar7 = std::__cxx11::string::c_str();
  this_00 = (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
             *)0x0;
  Xutf8SetWMProperties(uVar9,uVar1,uVar6,uVar7,0,0,0,0,0,uVar6,local_10,this_01);
  std::__cxx11::string::~string(local_138);
  std::locale::~locale(local_140);
  std::__cxx11::string::~string(local_110);
  std::locale::~locale(local_118);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(this_00);
  return;
}

Assistant:

void WindowImplX11::setTitle(const String& title)
{
    // Bare X11 has no Unicode window title support.
    // There is however an option to tell the window manager your Unicode title via hints.

    // Convert to UTF-8 encoding.
    std::basic_string<Uint8> utf8Title;
    Utf32::toUtf8(title.begin(), title.end(), std::back_inserter(utf8Title));

    Atom useUtf8 = getAtom("UTF8_STRING", false);

    // Set the _NET_WM_NAME atom, which specifies a UTF-8 encoded window title.
    Atom wmName = getAtom("_NET_WM_NAME", false);
    XChangeProperty(m_display, m_window, wmName, useUtf8, 8,
                    PropModeReplace, utf8Title.c_str(), static_cast<int>(utf8Title.size()));

    // Set the _NET_WM_ICON_NAME atom, which specifies a UTF-8 encoded window title.
    Atom wmIconName = getAtom("_NET_WM_ICON_NAME", false);
    XChangeProperty(m_display, m_window, wmIconName, useUtf8, 8,
                    PropModeReplace, utf8Title.c_str(), static_cast<int>(utf8Title.size()));

    // Set the non-Unicode title as a fallback for window managers who don't support _NET_WM_NAME.
    #ifdef X_HAVE_UTF8_STRING
    Xutf8SetWMProperties(m_display,
                         m_window,
                         title.toAnsiString().c_str(),
                         title.toAnsiString().c_str(),
                         NULL,
                         0,
                         NULL,
                         NULL,
                         NULL);
    #else
    XmbSetWMProperties(m_display,
                       m_window,
                       title.toAnsiString().c_str(),
                       title.toAnsiString().c_str(),
                       NULL,
                       0,
                       NULL,
                       NULL,
                       NULL);
    #endif
}